

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O1

void __thiscall Rml::ElementHandle::ProcessDefaultAction(ElementHandle *this,Event *event)

{
  Vector2f *drag_delta_min;
  Vector2f *drag_delta_max;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined1 auVar5 [16];
  Vector2f VVar6;
  Vector2f VVar7;
  undefined4 uVar8;
  bool bVar9;
  int iVar10;
  ElementHandle *pEVar11;
  ElementDocument *pEVar12;
  Element *pEVar13;
  Context *context;
  type pVVar14;
  float fVar15;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar16;
  HandleEdgeMarginParser parser;
  String edge_margin_str;
  String size_target_name;
  String move_target_name;
  undefined1 local_168 [40];
  pointer local_140;
  _Head_base<0UL,_Rml::PropertyIdNameMap_*,_false> local_138;
  float local_130;
  element_type *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  float local_ec;
  undefined1 local_e8 [8];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Element::ProcessDefaultAction(&this->super_Element,event);
  pEVar11 = (ElementHandle *)Event::GetTargetElement(event);
  if (pEVar11 == this) {
    if (this->initialised == false) {
      pEVar12 = Element::GetOwnerDocument(&this->super_Element);
      if (pEVar12 != (ElementDocument *)0x0) {
        pcVar1 = local_168 + 0x10;
        local_168._0_8_ = pcVar1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"move_target","");
        paVar2 = &local_b8.field_2;
        local_b8._M_dataplus._M_p = (pointer)paVar2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
        Element::GetAttribute<std::__cxx11::string>
                  (&local_50,&this->super_Element,(String *)local_168,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_168._0_8_ != pcVar1) {
          operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
        }
        if ((Vector2f)local_50._M_string_length != (Vector2f)0x0) {
          pEVar13 = Element::GetElementById(&this->super_Element,&local_50);
          this->move_target = pEVar13;
        }
        local_168._0_8_ = pcVar1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"size_target","");
        paVar3 = &local_d8.field_2;
        local_d8._M_dataplus._M_p = (pointer)paVar3;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
        Element::GetAttribute<std::__cxx11::string>
                  (&local_b8,&this->super_Element,(String *)local_168,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar3) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_168._0_8_ != pcVar1) {
          operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
        }
        if (local_b8._M_string_length != 0) {
          pEVar13 = Element::GetElementById(&this->super_Element,&local_b8);
          this->size_target = pEVar13;
        }
        local_168._0_8_ = pcVar1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"edge_margin","");
        paVar4 = &local_98.field_2;
        local_98._M_dataplus._M_p = (pointer)paVar4;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"0px","");
        Element::GetAttribute<std::__cxx11::string>
                  (&local_d8,&this->super_Element,(String *)local_168,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar4) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_168._0_8_ != pcVar1) {
          operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
        }
        (this->edge_margin)._M_elems[2].number = 0.0;
        (this->edge_margin)._M_elems[2].unit = UNKNOWN;
        (this->edge_margin)._M_elems[3].number = 0.0;
        (this->edge_margin)._M_elems[3].unit = UNKNOWN;
        (this->edge_margin)._M_elems[0].number = 0.0;
        (this->edge_margin)._M_elems[0].unit = UNKNOWN;
        (this->edge_margin)._M_elems[1].number = 0.0;
        (this->edge_margin)._M_elems[1].unit = UNKNOWN;
        iVar10 = ::std::__cxx11::string::compare((char *)&local_d8);
        if (iVar10 != 0) {
          HandleEdgeMarginParser::HandleEdgeMarginParser((HandleEdgeMarginParser *)local_168);
          bVar9 = HandleEdgeMarginParser::Parse
                            ((HandleEdgeMarginParser *)local_168,&local_d8,&this->edge_margin);
          if (!bVar9) {
            Element::GetAddress_abi_cxx11_(&local_98,&this->super_Element,false,true);
            Log::Message(LT_WARNING,"Failed to parse \'edge_margin\' attribute for element \'%s\'.",
                         local_98._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != paVar4) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
          }
          PropertySpecification::~PropertySpecification((PropertySpecification *)local_168);
        }
        this->initialised = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar3) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                                   local_50.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
    }
    bVar9 = Event::operator==(event,Dragstart);
    if (bVar9) {
      context = Element::GetContext(&this->super_Element);
      VVar6 = Event::GetUnprojectedMouseScreenPos(event);
      this->drag_start = VVar6;
      drag_delta_min = &this->drag_delta_min;
      (this->drag_delta_min).x = -3.4028235e+38;
      (this->drag_delta_min).y = -3.4028235e+38;
      (this->drag_delta_max).x = 3.4028235e+38;
      (this->drag_delta_max).y = 3.4028235e+38;
      drag_delta_max = &this->drag_delta_max;
      if (context != (Context *)0x0 && this->move_target != (Element *)0x0) {
        ElementHandleTargetData::ElementHandleTargetData
                  ((ElementHandleTargetData *)local_168,this->move_target,context,&this->edge_margin
                  );
        ElementHandleTargetData::GetMoveData
                  ((MoveData *)&local_50,(ElementHandleTargetData *)local_168,drag_delta_min,
                   drag_delta_max);
        uVar8 = local_50.field_2._M_allocated_capacity._0_4_;
        (this->move_data).top_left.x = (bool)local_50.field_2._M_allocated_capacity._0_1_;
        (this->move_data).top_left.y = (bool)local_50.field_2._M_local_buf[1];
        (this->move_data).bottom_right.x = (bool)local_50.field_2._M_local_buf[2];
        (this->move_data).bottom_right.y = (bool)local_50.field_2._M_local_buf[3];
        (this->move_data).original_position_top_left = (Vector2f)local_50._M_dataplus._M_p;
        (this->move_data).original_position_bottom_right.x =
             (float)(undefined4)local_50._M_string_length;
        (this->move_data).original_position_bottom_right.y = (float)local_50._M_string_length._4_4_;
        local_50.field_2._M_allocated_capacity._0_4_ = uVar8;
      }
      if (this->size_target != (Element *)0x0 && context != (Context *)0x0) {
        ElementHandleTargetData::ElementHandleTargetData
                  ((ElementHandleTargetData *)local_168,this->size_target,context,&this->edge_margin
                  );
        ElementHandleTargetData::GetSizeData
                  ((SizeData *)&local_50,(ElementHandleTargetData *)local_168,drag_delta_min,
                   drag_delta_max);
        (this->size_data).width_height.x = (bool)local_50.field_2._M_allocated_capacity._0_1_;
        (this->size_data).width_height.y = (bool)local_50.field_2._M_local_buf[1];
        (this->size_data).bottom_right.x = (bool)local_50.field_2._M_local_buf[2];
        (this->size_data).bottom_right.y = (bool)local_50.field_2._M_local_buf[3];
        (this->size_data).original_size = (Vector2f)local_50._M_dataplus._M_p;
        (this->size_data).original_position_bottom_right.x =
             (float)(undefined4)local_50._M_string_length;
        (this->size_data).original_position_bottom_right.y = (float)local_50._M_string_length._4_4_;
      }
      VVar6 = Math::Min<Rml::Vector2<float>>(*drag_delta_min,(Vector2f)0x0);
      *drag_delta_min = VVar6;
      VVar6 = Math::Max<Rml::Vector2<float>>(*drag_delta_max,(Vector2f)0x0);
      *drag_delta_max = VVar6;
    }
    else {
      bVar9 = Event::operator==(event,Drag);
      if (bVar9) {
        VVar7 = Event::GetUnprojectedMouseScreenPos(event);
        VVar6.y = VVar7.y - (this->drag_start).y;
        VVar6.x = VVar7.x - (this->drag_start).x;
        VVar6 = Math::Clamp<Rml::Vector2<float>>(VVar6,this->drag_delta_min,this->drag_delta_max);
        local_78 = VVar6.y;
        auVar5._8_4_ = extraout_XMM0_Dc;
        auVar5._0_4_ = VVar6.x;
        auVar5._4_4_ = VVar6.y;
        auVar5._12_4_ = extraout_XMM0_Dd;
        fStack_74 = local_78;
        fStack_70 = local_78;
        fStack_6c = local_78;
        local_68 = auVar5;
        if (this->move_target != (Element *)0x0) {
          local_68._0_4_ = VVar6.x;
          fVar15 = (this->move_data).original_position_top_left.x + (float)local_68._0_4_;
          fVar16 = (this->move_data).original_position_top_left.y + local_78;
          fVar15 = Math::Round(fVar15);
          local_e8._0_4_ = fVar15;
          fVar15 = Math::Round(fVar16);
          fVar16 = (this->move_data).original_position_bottom_right.y - local_78;
          local_ec = Math::Round((this->move_data).original_position_bottom_right.x -
                                 (float)local_68._0_4_);
          fVar16 = Math::Round(fVar16);
          if ((this->move_data).top_left.x == true) {
            pEVar13 = this->move_target;
            local_168._0_8_ = (pointer)0x2d;
            Variant::Set((Variant *)local_168,(float)local_e8._0_4_);
            local_140 = (pointer)0xffffffff00000040;
            local_138._M_head_impl = (PropertyIdNameMap *)0x0;
            local_130 = -NAN;
            local_128 = (element_type *)0x0;
            _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            Element::SetProperty(pEVar13,Left,(Property *)local_168);
            if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
            }
            Variant::~Variant((Variant *)local_168);
          }
          if ((this->move_data).top_left.y == true) {
            pEVar13 = this->move_target;
            local_168._0_8_ = (pointer)0x2d;
            Variant::Set((Variant *)local_168,fVar15);
            local_140 = (pointer)0xffffffff00000040;
            local_138._M_head_impl = (PropertyIdNameMap *)0x0;
            local_130 = -NAN;
            local_128 = (element_type *)0x0;
            _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            Element::SetProperty(pEVar13,Top,(Property *)local_168);
            if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
            }
            Variant::~Variant((Variant *)local_168);
          }
          if ((this->move_data).bottom_right.x == true) {
            pEVar13 = this->move_target;
            local_168._0_8_ = (pointer)0x2d;
            Variant::Set((Variant *)local_168,local_ec);
            local_140 = (pointer)0xffffffff00000040;
            local_138._M_head_impl = (PropertyIdNameMap *)0x0;
            local_130 = -NAN;
            local_128 = (element_type *)0x0;
            _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            Element::SetProperty(pEVar13,Right,(Property *)local_168);
            if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
            }
            Variant::~Variant((Variant *)local_168);
          }
          if ((this->move_data).bottom_right.y == true) {
            pEVar13 = this->move_target;
            local_168._0_8_ = (pointer)0x2d;
            Variant::Set((Variant *)local_168,fVar16);
            local_140 = (pointer)0xffffffff00000040;
            local_138._M_head_impl = (PropertyIdNameMap *)0x0;
            local_130 = -NAN;
            local_128 = (element_type *)0x0;
            _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            Element::SetProperty(pEVar13,Bottom,(Property *)local_168);
            if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
            }
            Variant::~Variant((Variant *)local_168);
          }
        }
        if (this->size_target != (Element *)0x0) {
          fVar15 = (this->size_data).original_size.y + local_78;
          local_e8._0_4_ = Math::Round((this->size_data).original_size.x + (float)local_68._0_4_);
          local_e8._4_4_ = extraout_XMM0_Db;
          uStack_e0 = extraout_XMM0_Dc_00;
          uStack_dc = extraout_XMM0_Dd_00;
          fVar15 = Math::Round(fVar15);
          VVar7.y = fVar15;
          VVar7.x = (float)local_e8._0_4_;
          VVar6 = Math::Max<Rml::Vector2<float>>(VVar7,(Vector2f)0x0);
          uStack_e0 = extraout_XMM0_Dc_01;
          local_e8._0_4_ = VVar6.x;
          local_e8._4_4_ = VVar6.y;
          uStack_dc = extraout_XMM0_Dd_01;
          fVar16 = (this->size_data).original_position_bottom_right.y - local_78;
          fVar15 = Math::Round((this->size_data).original_position_bottom_right.x -
                               (float)local_68._0_4_);
          fVar16 = Math::Round(fVar16);
          if ((this->size_data).width_height.x == true) {
            pEVar13 = this->size_target;
            local_168._0_8_ = (pointer)0x2d;
            Variant::Set((Variant *)local_168,(float)local_e8._0_4_);
            local_140 = (pointer)0xffffffff00000040;
            local_138._M_head_impl = (PropertyIdNameMap *)0x0;
            local_130 = -NAN;
            local_128 = (element_type *)0x0;
            _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            Element::SetProperty(pEVar13,Width,(Property *)local_168);
            if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
            }
            Variant::~Variant((Variant *)local_168);
          }
          if ((this->size_data).width_height.y == true) {
            pEVar13 = this->size_target;
            local_168._0_8_ = (pointer)0x2d;
            Variant::Set((Variant *)local_168,(float)local_e8._4_4_);
            local_140 = (pointer)0xffffffff00000040;
            local_138._M_head_impl = (PropertyIdNameMap *)0x0;
            local_130 = -NAN;
            local_128 = (element_type *)0x0;
            _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            Element::SetProperty(pEVar13,Height,(Property *)local_168);
            if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
            }
            Variant::~Variant((Variant *)local_168);
          }
          if ((this->size_data).bottom_right.x == true) {
            pEVar13 = this->size_target;
            local_168._0_8_ = (pointer)0x2d;
            Variant::Set((Variant *)local_168,fVar15);
            local_140 = (pointer)0xffffffff00000040;
            local_138._M_head_impl = (PropertyIdNameMap *)0x0;
            local_130 = -NAN;
            local_128 = (element_type *)0x0;
            _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            Element::SetProperty(pEVar13,Right,(Property *)local_168);
            if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
            }
            Variant::~Variant((Variant *)local_168);
          }
          if ((this->size_data).bottom_right.y == true) {
            pEVar13 = this->size_target;
            local_168._0_8_ = (pointer)0x2d;
            Variant::Set((Variant *)local_168,fVar16);
            local_140 = (pointer)0xffffffff00000040;
            local_138._M_head_impl = (PropertyIdNameMap *)0x0;
            local_130 = -NAN;
            local_128 = (element_type *)0x0;
            _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            Element::SetProperty(pEVar13,Bottom,(Property *)local_168);
            if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
            }
            Variant::~Variant((Variant *)local_168);
          }
        }
        local_168._0_8_ = (pointer)0x0;
        local_168._8_8_ = (ComputedValues *)0x0;
        local_168._16_8_ = 0;
        pVVar14 = itlib::
                  flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                  ::operator[]<char_const(&)[9]>
                            ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                              *)local_168,(char (*) [9])"handle_x");
        Variant::Clear(pVVar14);
        Variant::Set(pVVar14,(float)local_68._0_4_);
        pVVar14 = itlib::
                  flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                  ::operator[]<char_const(&)[9]>
                            ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                              *)local_168,(char (*) [9])"handle_y");
        Variant::Clear(pVVar14);
        Variant::Set(pVVar14,local_78);
        Element::DispatchEvent(&this->super_Element,Handledrag,(Dictionary *)local_168);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                   *)local_168);
      }
    }
  }
  return;
}

Assistant:

void ElementHandle::ProcessDefaultAction(Event& event)
{
	Element::ProcessDefaultAction(event);

	if (event.GetTargetElement() == this)
	{
		if (!initialised && GetOwnerDocument())
		{
			const String move_target_name = GetAttribute<String>("move_target", "");
			if (!move_target_name.empty())
				move_target = GetElementById(move_target_name);

			const String size_target_name = GetAttribute<String>("size_target", "");
			if (!size_target_name.empty())
				size_target = GetElementById(size_target_name);

			const String edge_margin_str = GetAttribute<String>("edge_margin", "0px");
			edge_margin = {};
			if (edge_margin_str != "none")
			{
				HandleEdgeMarginParser parser;
				if (!parser.Parse(edge_margin_str, edge_margin))
					Log::Message(Log::LT_WARNING, "Failed to parse 'edge_margin' attribute for element '%s'.", GetAddress().c_str());
			}

			initialised = true;
		}

		if (event == EventId::Dragstart)
		{
			using namespace Style;
			Context* context = GetContext();
			drag_start = event.GetUnprojectedMouseScreenPos();
			drag_delta_min = {-FLT_MAX, -FLT_MAX};
			drag_delta_max = {FLT_MAX, FLT_MAX};

			if (move_target && context)
			{
				ElementHandleTargetData move_target_data(move_target, context, edge_margin);
				move_data = move_target_data.GetMoveData(drag_delta_min, drag_delta_max);
			}

			if (size_target && context)
			{
				ElementHandleTargetData size_target_data(size_target, context, edge_margin);
				size_data = size_target_data.GetSizeData(drag_delta_min, drag_delta_max);
			}

			drag_delta_min = Math::Min(drag_delta_min, Vector2f{0, 0});
			drag_delta_max = Math::Max(drag_delta_max, Vector2f{0, 0});
		}
		else if (event == EventId::Drag)
		{
			const Vector2f delta = Math::Clamp(event.GetUnprojectedMouseScreenPos() - drag_start, drag_delta_min, drag_delta_max);

			if (move_target)
			{
				const Vector2f new_position_top_left = (move_data.original_position_top_left + delta).Round();
				const Vector2f new_position_bottom_right = (move_data.original_position_bottom_right - delta).Round();

				if (move_data.top_left.x)
					move_target->SetProperty(PropertyId::Left, Property(new_position_top_left.x, Unit::PX));
				if (move_data.top_left.y)
					move_target->SetProperty(PropertyId::Top, Property(new_position_top_left.y, Unit::PX));
				if (move_data.bottom_right.x)
					move_target->SetProperty(PropertyId::Right, Property(new_position_bottom_right.x, Unit::PX));
				if (move_data.bottom_right.y)
					move_target->SetProperty(PropertyId::Bottom, Property(new_position_bottom_right.y, Unit::PX));
			}

			if (size_target)
			{
				const Vector2f new_size = Math::Max((size_data.original_size + delta).Round(), Vector2f(0.f));
				const Vector2f new_position_bottom_right = (size_data.original_position_bottom_right - delta).Round();

				if (size_data.width_height.x)
					size_target->SetProperty(PropertyId::Width, Property(new_size.x, Unit::PX));
				if (size_data.width_height.y)
					size_target->SetProperty(PropertyId::Height, Property(new_size.y, Unit::PX));
				if (size_data.bottom_right.x)
					size_target->SetProperty(PropertyId::Right, Property(new_position_bottom_right.x, Unit::PX));
				if (size_data.bottom_right.y)
					size_target->SetProperty(PropertyId::Bottom, Property(new_position_bottom_right.y, Unit::PX));
			}

			Dictionary parameters;
			parameters["handle_x"] = delta.x;
			parameters["handle_y"] = delta.y;
			DispatchEvent(EventId::Handledrag, parameters);
		}
	}
}